

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringutils.h
# Opt level: O0

void hexdumpgroups<unsigned_char*>(string *str,uchar *buf,size_t nLength,int groupsize,char sep)

{
  uint8_t b;
  char *pcVar1;
  size_t sVar2;
  bool bVar3;
  int local_34;
  char *pcStack_30;
  int i;
  char *p;
  char sep_local;
  size_t sStack_20;
  int groupsize_local;
  size_t nLength_local;
  uchar *buf_local;
  string *str_local;
  
  std::__cxx11::string::size();
  std::__cxx11::string::resize((ulong)str);
  std::__cxx11::string::size();
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)str);
  local_34 = 0;
  sStack_20 = nLength;
  nLength_local = (size_t)buf;
  while (pcStack_30 = pcVar1, sVar2 = sStack_20 - 1, sStack_20 != 0) {
    b = get8<unsigned_char*>((uchar *)nLength_local);
    byte2hexchars(b,pcStack_30);
    nLength_local = nLength_local + 1;
    bVar3 = local_34 == groupsize + -1;
    local_34 = local_34 + 1;
    pcVar1 = pcStack_30 + 2;
    sStack_20 = sVar2;
    if (bVar3) {
      pcStack_30[2] = sep;
      local_34 = 0;
      pcVar1 = pcStack_30 + 3;
    }
  }
  return;
}

Assistant:

void hexdumpgroups(std::string &str, I buf, size_t nLength, int groupsize, char sep=' ')
{
    str.resize(str.size()+nLength*3);
    char *p= &str[str.size()-nLength*3];
    int i= 0;
    while(nLength--)
    {
        byte2hexchars(get8(buf), p); p+=2; buf++;

        if (i++ == groupsize-1) {
            *p++ = sep;
            i= 0;
        }
    }
}